

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_exhaustive_pass.cpp
# Opt level: O2

Status __thiscall spvtools::opt::InlineExhaustivePass::ProcessImpl(InlineExhaustivePass *this)

{
  Status SVar1;
  Status status;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_30._M_unused._M_object = &status;
  status = SuccessWithoutChange;
  local_18 = std::
             _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_exhaustive_pass.cpp:64:25)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_exhaustive_pass.cpp:64:25)>
             ::_M_manager;
  local_30._8_8_ = this;
  IRContext::ProcessReachableCallTree
            ((this->super_InlinePass).super_Pass.context_,(ProcessFunction *)&local_30);
  SVar1 = status;
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return SVar1;
}

Assistant:

Pass::Status InlineExhaustivePass::ProcessImpl() {
  Status status = Status::SuccessWithoutChange;
  // Attempt exhaustive inlining on each entry point function in module
  ProcessFunction pfn = [&status, this](Function* fp) {
    status = CombineStatus(status, InlineExhaustive(fp));
    return false;
  };
  context()->ProcessReachableCallTree(pfn);
  return status;
}